

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void anon_unknown.dwarf_bf6b6b::processLinkDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *directories,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueDirectories,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugDirectories,string *language)

{
  TargetPropertyEntry *pTVar1;
  cmLocalGenerator *this;
  int iVar2;
  PolicyStatus PVar3;
  string *psVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  long *plVar6;
  cmake *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar7;
  long *plVar8;
  size_type *psVar9;
  PolicyID id;
  MessageType t;
  pointer in_name;
  __hashtable *__h;
  bool bVar10;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar11;
  string usedDirectories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryDirectories;
  ostringstream e;
  string local_2a0;
  cmGeneratorTarget *local_280;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  long *local_218 [2];
  long local_208 [2];
  pointer local_1f8;
  cmGeneratorExpressionDAGChecker *local_1f0;
  string *local_1e8;
  TargetPropertyEntry *local_1e0;
  pointer local_1d8;
  PolicyMap *local_1d0;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1c8;
  string *local_1c0;
  cmListFileBacktrace local_1b8;
  undefined1 local_1a8 [16];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  ios_base local_138 [264];
  
  local_1d8 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d8 != local_1f8) {
    local_1d0 = &tgt->PolicyMap;
    local_280 = tgt;
    local_1f0 = dagChecker;
    local_1e8 = config;
    local_1c8 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                directories;
    do {
      pTVar1 = *local_1d8;
      psVar4 = cmLinkItem::AsStr_abi_cxx11_(&pTVar1->LinkImplItem->super_cmLinkItem);
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e0 = pTVar1;
      iVar2 = (*pTVar1->_vptr_TargetPropertyEntry[3])
                        (pTVar1,local_280->LocalGenerator,local_1e8,0,local_280,local_1f0,language);
      cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar2),&local_238,false);
      local_278 = &local_268;
      local_270 = 0;
      local_268 = 0;
      local_1c0 = local_238.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar10 = local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      in_name = local_238.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (!bVar10) {
        bVar10 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (!bVar10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          if (psVar4->_M_string_length == 0) {
            PVar3 = cmPolicies::PolicyMap::Get(local_1d0,CMP0081);
            t = FATAL_ERROR;
            if (PVar3 == OLD) {
              bVar10 = true;
            }
            else {
              if (PVar3 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a0,(cmPolicies *)0x51,id);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,
                                    local_2a0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
                t = AUTHOR_WARNING;
              }
              bVar10 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Found relative path while evaluating link directories of \"",0x3a);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(local_280->Target->Name)._M_dataplus._M_p,
                                (local_280->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  \"",6);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(in_name->_M_dataplus)._M_p,in_name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,
                                psVar4->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \"",
                       0x3f);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(in_name->_M_dataplus)._M_p,in_name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
            t = FATAL_ERROR;
            bVar10 = false;
          }
          if (!bVar10) {
            this = local_280->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this,t,&local_2a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (t == FATAL_ERROR) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              if (local_278 != &local_268) {
                operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_238);
              return;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        cmsys::SystemTools::ConvertToUnixSlashes(in_name);
        local_1a8._0_8_ = uniqueDirectories;
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)uniqueDirectories,in_name,local_1a8);
        if ((((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
           (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string&>(local_1c8,in_name), debugDirectories)) {
          std::operator+(&local_2a0," * ",in_name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
          local_1a8._0_8_ = &local_198;
          puVar7 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(plVar6 + 2);
          if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)*plVar6 == puVar7) {
            local_198._M_h._M_buckets = (puVar7->_M_h)._M_buckets;
            local_198._M_h._M_bucket_count = plVar6[3];
          }
          else {
            local_198._M_h._M_buckets = (puVar7->_M_h)._M_buckets;
            local_1a8._0_8_ =
                 (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)*plVar6;
          }
          local_1a8._8_8_ = plVar6[1];
          *plVar6 = (long)puVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_278,local_1a8._0_8_);
          if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(long)local_198._M_h._M_buckets + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
        }
        in_name = in_name + 1;
        bVar10 = in_name == local_1c0;
      }
      if (local_270 != 0) {
        this_00 = cmLocalGenerator::GetCMakeInstance(local_280->LocalGenerator);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_218,"Used link directories for target ","");
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_218,
                                    (ulong)(local_280->Target->Name)._M_dataplus._M_p);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_248 = *plVar8;
          lStack_240 = plVar6[3];
          local_258 = &local_248;
        }
        else {
          local_248 = *plVar8;
          local_258 = (long *)*plVar6;
        }
        local_250 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2a0.field_2._M_allocated_capacity = *psVar9;
          local_2a0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar9;
          local_2a0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2a0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_278);
        local_1a8._0_8_ = &local_198;
        puVar7 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(plVar6 + 2);
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)*plVar6 == puVar7) {
          local_198._M_h._M_buckets = (puVar7->_M_h)._M_buckets;
          local_198._M_h._M_bucket_count = plVar6[3];
        }
        else {
          local_198._M_h._M_buckets = (puVar7->_M_h)._M_buckets;
          local_1a8._0_8_ =
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)*plVar6;
        }
        local_1a8._8_8_ = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (*local_1e0->_vptr_TargetPropertyEntry[4])(&local_1b8);
        cmake::IssueMessage(this_00,LOG,(string *)local_1a8,&local_1b8);
        if (local_1b8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(long)local_198._M_h._M_buckets + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258,local_248 + 1);
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_238);
      local_1d8 = local_1d8 + 1;
    } while ((bool)(bVar10 & local_1d8 != local_1f8));
  }
  return;
}

Assistant:

void processLinkDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& directories,
  std::unordered_set<std::string>& uniqueDirectories,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugDirectories, std::string const& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();

    std::vector<std::string> entryDirectories;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryDirectories);

    std::string usedDirectories;
    for (std::string& entryDirectory : entryDirectories) {
      if (!cmSystemTools::FileIsFullPath(entryDirectory)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_LINK_DIRECTORIES:\n"
            "  \"" << entryDirectory << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0081()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0081) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating link directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryDirectory << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      // Sanitize the path the same way the link_directories command does
      // in case projects set the LINK_DIRECTORIES property directly.
      cmSystemTools::ConvertToUnixSlashes(entryDirectory);
      if (uniqueDirectories.insert(entryDirectory).second) {
        directories.emplace_back(entryDirectory);
        if (debugDirectories) {
          usedDirectories += " * " + entryDirectory + "\n";
        }
      }
    }
    if (!usedDirectories.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used link directories for target ") + tgt->GetName() +
          ":\n" + usedDirectories,
        entry->GetBacktrace());
    }
  }
}